

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_java_validator(t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  e_req eVar2;
  ostream *poVar3;
  reference pptVar4;
  string *psVar5;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  t_field **local_68;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"public void validate() throws TException {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"// check for required fields");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  local_68 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_68;
  while( true ) {
    local_70._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_70);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    eVar2 = t_field::get_req(*pptVar4);
    if (eVar2 == T_REQUIRED) {
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_90);
      poVar3 = std::operator<<(poVar3,"if (!");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      generate_isset_check_abi_cxx11_(&local_b0,this,*pptVar4);
      poVar3 = std::operator<<(poVar3,(string *)&local_b0);
      poVar3 = std::operator<<(poVar3,") {");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_d0);
      poVar3 = std::operator<<(poVar3,"  throw new TProtocolException(\"Required field \'");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
      poVar3 = std::operator<<(poVar3,(string *)psVar5);
      poVar3 = std::operator<<(poVar3,"\' is unset! Struct:\" + toString());");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_f0);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_javame_generator::generate_java_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public void validate() throws TException {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      out << indent() << "if (!" << generate_isset_check(*f_iter) << ") {" << endl << indent()
          << "  throw new TProtocolException(\"Required field '" << (*f_iter)->get_name()
          << "' is unset! Struct:\" + toString());" << endl << indent() << "}" << endl << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}